

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O0

void lsvm::hashset::copy_into_new_bucket
               (hashset *h,hashbucket **pb,hashbucket **b,uint32_t new_size_indx)

{
  long lVar1;
  hashbucket *phVar2;
  hashbucket *phVar3;
  undefined4 in_ECX;
  undefined8 *in_RDX;
  long in_RDI;
  entry *ehe;
  entry *he;
  hashbucket *ob;
  hash in_stack_00000038;
  hashset *in_stack_00000040;
  undefined8 in_stack_ffffffffffffffc8;
  uint32_t indx;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  indx = (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  phVar2 = (hashbucket *)*in_RDX;
  *in_RDX = *(undefined8 *)*in_RDX;
  add_new_bucket((hashset *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(hashbucket **)phVar2,
                 (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38));
  *(uint32_t *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) - phVar2->count;
  balance_partition((hashbucket **)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  phVar2 = (hashbucket *)entries(phVar2);
  phVar3 = (hashbucket *)get_entry(phVar2,indx);
  for (; phVar2 <= phVar3; phVar2 = phVar2 + 1) {
    lVar1._0_4_ = phVar2->count;
    lVar1._4_4_ = phVar2->bucket_size_indx;
    if (lVar1 != 0) {
      insert_into_partition(in_stack_00000040,in_stack_00000038,h._6_2_,pb,b._7_1_);
    }
  }
  memory::retain(phVar2);
  balance_partition((hashbucket **)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

inline void copy_into_new_bucket(hashset* h, hashbucket** pb, hashbucket** b, uint32_t new_size_indx){

    // remove current bucket from partition and add new bigger one
    hashbucket* ob = *b;
    *b = (*b)->next;
    add_new_bucket(h,pb,new_size_indx);
    h->count -= ob->count;
    
    // rebalance partition
    balance_partition(pb);

    // insert left-over keys into partition
    entry* he = entries(ob); 
    entry* ehe = get_entry(ob,bucket_size(ob)-1); 
    while(he <= ehe){
        if(he->val != null){
            insert_into_partition(h,he->valhash,hashbit(he->valhash,h->bits),he->val,true);
        }
        ++he;
    }
    
    // remove old bucket
    lsvm::memory::retain(ob);

    // rebalance partition
    balance_partition(pb);
}